

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O3

void __thiscall cashew::JSPrinter::printDo(JSPrinter *this,Ref node)

{
  size_t sVar1;
  undefined8 *puVar2;
  Value *local_20;
  Ref node_local;
  
  local_20 = node.inst;
  emit(this,"do");
  safeSpace(this);
  puVar2 = (undefined8 *)cashew::Ref::operator[]((uint)&local_20);
  print(this,(Value *)*puVar2,"{}");
  space(this);
  emit(this,"while");
  space(this);
  maybeSpace(this,'(');
  ensure(this,1);
  sVar1 = this->used;
  this->used = sVar1 + 1;
  this->buffer[sVar1] = '(';
  puVar2 = (undefined8 *)cashew::Ref::operator[]((uint)&local_20);
  print(this,(Value *)*puVar2);
  maybeSpace(this,')');
  ensure(this,1);
  sVar1 = this->used;
  this->used = sVar1 + 1;
  this->buffer[sVar1] = ')';
  return;
}

Assistant:

void printDo(Ref node) {
    emit("do");
    safeSpace();
    print(node[2], "{}");
    space();
    emit("while");
    space();
    emit('(');
    print(node[1]);
    emit(')');
  }